

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O0

undefined8
StringBuilder<char[6],std::__cxx11::string&,std::__cxx11::string_const&,char_const(&)[2],char_const&,char_const(&)[2],char_const&>
          (char (*arg) [6],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          char (*args_2) [2],char *args_3,char (*args_4) [2],char *args_5)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  undefined8 in_RDI;
  char (*in_R8) [2];
  char *in_R9;
  char *unaff_retaddr;
  string local_70 [8];
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string local_50 [24];
  char (*in_stack_ffffffffffffffc8) [2];
  
  StringBuilder_abi_cxx11_(in_stack_ffffffffffffff98);
  StringBuilder<std::__cxx11::string,std::__cxx11::string_const&,char_const(&)[2],char_const&,char_const(&)[2],char_const&>
            (in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc8,unaff_retaddr);
  std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  return in_RDI;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}